

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_field_info.h
# Opt level: O2

void __thiscall
google::protobuf::internal::MapDynamicFieldInfo<proto2_unittest::TestMap>::MapDynamicFieldInfo
          (MapDynamicFieldInfo<proto2_unittest::TestMap> *this,Reflection *r,TestMap *m,
          FieldDescriptor *f,FieldDescriptor *key_f,FieldDescriptor *val_f,MapFieldBase *map_field)

{
  bool bVar1;
  char *failure_msg;
  int line;
  LogMessage local_28;
  FieldDescriptor *local_18;
  FieldDescriptor *local_10;
  
  this->reflection = r;
  this->message = m;
  this->field = f;
  this->key = key_f;
  this->value = val_f;
  this->const_map_field = map_field;
  local_18 = val_f;
  local_10 = key_f;
  bVar1 = FieldDescriptor::is_map(f);
  if (bVar1) {
    local_28.errno_saver_.saved_errno_ = 0;
    local_28._4_4_ = 0;
    failure_msg = absl::lts_20250127::log_internal::
                  Check_NEImpl<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>
                            (&local_10,(void **)&local_28,"key_f != nullptr");
    if (failure_msg == (Nullable<const_char_*>)0x0) {
      local_28.errno_saver_.saved_errno_ = 0;
      local_28._4_4_ = 0;
      failure_msg = absl::lts_20250127::log_internal::
                    Check_NEImpl<google::protobuf::FieldDescriptor_const*,decltype(nullptr)>
                              (&local_18,(void **)&local_28,"val_f != nullptr");
      if (failure_msg == (Nullable<const_char_*>)0x0) {
        return;
      }
      line = 0x545;
    }
    else {
      line = 0x544;
    }
  }
  else {
    failure_msg = "f->is_map()";
    line = 0x543;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_field_info.h"
             ,line,failure_msg);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

constexpr MapDynamicFieldInfo(const Reflection* r, MessageT& m,
                                const FieldDescriptor* f,
                                const FieldDescriptor* key_f,
                                const FieldDescriptor* val_f,
                                const MapFieldBase& map_field)
      : reflection(r),
        message(m),
        field(f),
        key(key_f),
        value(val_f),
        const_map_field(map_field) {
    ABSL_DCHECK(f->is_map());
    ABSL_DCHECK_NE(key_f, nullptr);
    ABSL_DCHECK_NE(val_f, nullptr);
  }